

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeCooperativeVectorTypeNV(Builder *this,Id componentType,Id components)

{
  key_type kVar1;
  Id IVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference ppIVar5;
  Instruction *this_00;
  value_type local_40;
  key_type local_38 [4];
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  Id components_local;
  Id componentType_local;
  Builder *this_local;
  
  local_38[3] = 0;
  type._0_4_ = components;
  type._4_4_ = componentType;
  _components_local = this;
  while( true ) {
    kVar1 = local_38[3];
    local_38[2] = 0x14a8;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_38 + 2);
    sVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar3);
    if ((int)sVar4 <= (int)kVar1) {
      this_00 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      spv::Instruction::Instruction(this_00,IVar2,0,OpTypeCooperativeVectorNV);
      pIStack_28 = this_00;
      spv::Instruction::addIdOperand(this_00,type._4_4_);
      spv::Instruction::addIdOperand(pIStack_28,(Id)type);
      local_38[0] = 0x14a8;
      pmVar3 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_38);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar3,&stack0xffffffffffffffd8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_40,
                 pIStack_28);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_40);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_40);
      Module::mapInstruction(&this->module,pIStack_28);
      IVar2 = spv::Instruction::getResultId(pIStack_28);
      return IVar2;
    }
    local_38[1] = 0x14a8;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_38 + 1);
    ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar3,(long)(int)local_38[3]);
    pIStack_28 = *ppIVar5;
    IVar2 = spv::Instruction::getIdOperand(pIStack_28,0);
    if ((IVar2 == type._4_4_) &&
       (IVar2 = spv::Instruction::getIdOperand(pIStack_28,1), IVar2 == (Id)type)) break;
    local_38[3] = local_38[3] + 1;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_28);
  return IVar2;
}

Assistant:

Id Builder::makeCooperativeVectorTypeNV(Id componentType, Id components)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeCooperativeVectorNV].size(); ++t) {
        type = groupedTypes[OpTypeCooperativeVectorNV][t];
        if (type->getIdOperand(0) == componentType &&
            type->getIdOperand(1) == components)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeCooperativeVectorNV);
    type->addIdOperand(componentType);
    type->addIdOperand(components);
    groupedTypes[OpTypeCooperativeVectorNV].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}